

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateUniqueness(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  DiagnosticStream *pDVar2;
  uint32_t local_20c;
  char *local_208;
  DiagnosticStream local_200;
  Op local_24;
  Instruction *pIStack_20;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  bVar1 = ValidationState_t::HasExtension(_,kSPV_VALIDATOR_ignore_type_decl_unique);
  if (((((!bVar1) && (local_24 = val::Instruction::opcode(pIStack_20), local_24 != OpTypeArray)) &&
       (local_24 != OpTypeRuntimeArray)) &&
      ((local_24 != OpTypeNodePayloadArrayAMDX && (local_24 != OpTypeStruct)))) &&
     ((local_24 != OpTypePointer &&
      ((local_24 != OpTypeUntypedPointerKHR &&
       (bVar1 = ValidationState_t::RegisterUniqueTypeDeclaration
                          ((ValidationState_t *)inst_local,pIStack_20), !bVar1)))))) {
    ValidationState_t::diag
              (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
    pDVar2 = DiagnosticStream::operator<<
                       (&local_200,
                        (char (*) [68])
                        "Duplicate non-aggregate type declarations are not allowed. Opcode: ");
    local_208 = spvOpcodeString(local_24);
    pDVar2 = DiagnosticStream::operator<<(pDVar2,&local_208);
    pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [6])" id: ");
    local_20c = val::Instruction::id(pIStack_20);
    pDVar2 = DiagnosticStream::operator<<(pDVar2,&local_20c);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
    DiagnosticStream::~DiagnosticStream(&local_200);
    return __local._4_4_;
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateUniqueness(ValidationState_t& _, const Instruction* inst) {
  if (_.HasExtension(Extension::kSPV_VALIDATOR_ignore_type_decl_unique))
    return SPV_SUCCESS;

  const auto opcode = inst->opcode();
  if (opcode != spv::Op::OpTypeArray && opcode != spv::Op::OpTypeRuntimeArray &&
      opcode != spv::Op::OpTypeNodePayloadArrayAMDX &&
      opcode != spv::Op::OpTypeStruct && opcode != spv::Op::OpTypePointer &&
      opcode != spv::Op::OpTypeUntypedPointerKHR &&
      !_.RegisterUniqueTypeDeclaration(inst)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Duplicate non-aggregate type declarations are not allowed. "
              "Opcode: "
           << spvOpcodeString(opcode) << " id: " << inst->id();
  }

  return SPV_SUCCESS;
}